

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  byte bVar1;
  handle hVar2;
  instance *piVar3;
  void *pvVar4;
  cast_error *pcVar5;
  handle *this;
  PyObject *tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string type_name;
  void **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _func_void_ptr_void_ptr *local_40;
  handle local_38;
  object inst;
  
  if (tinfo == (type_info *)0x0) {
    return (handle)(PyObject *)0x0;
  }
  if (_src == (void *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    this = (handle *)local_98;
    hVar2.m_ptr = (PyObject *)&_Py_NoneStruct;
    goto LAB_002f9771;
  }
  local_40 = copy_constructor;
  hVar2 = find_registered_python_instance(_src,tinfo);
  if (hVar2.m_ptr != (PyObject *)0x0) {
    return (handle)hVar2.m_ptr;
  }
  piVar3 = (instance *)make_new_instance(tinfo->type);
  piVar3->field_0x30 = piVar3->field_0x30 & 0xfe;
  local_60._M_dataplus._M_p = (pointer)piVar3;
  local_38.m_ptr = (PyObject *)piVar3;
  local_60._M_string_length = (size_type)all_type_info((piVar3->ob_base).ob_type);
  values_and_holders::begin((iterator *)local_98,(values_and_holders *)&local_60);
  switch(policy) {
  case automatic:
  case take_ownership:
    *local_70 = _src;
    goto LAB_002f9756;
  case automatic_reference:
  case reference:
    *local_70 = _src;
    bVar1 = piVar3->field_0x30 & 0xfe;
    goto LAB_002f975c;
  case copy:
    if (local_40 == (_func_void_ptr_void_ptr *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)&local_60);
      clean_type_id((string *)local_98);
      pcVar5 = (cast_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b8,"return_value_policy = copy, but type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::operator+(&local_60,&local_b8," is non-copyable!");
      cast_error::runtime_error(pcVar5,&local_60);
      __cxa_throw(pcVar5,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = (*local_40)(_src);
    break;
  case move:
    if ((move_constructor == (_func_void_ptr_void_ptr *)0x0) &&
       (move_constructor = local_40, local_40 == (_func_void_ptr_void_ptr *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)&local_60);
      clean_type_id((string *)local_98);
      pcVar5 = (cast_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b8,"return_value_policy = move, but type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::operator+(&local_60,&local_b8," is neither movable nor copyable!");
      cast_error::runtime_error(pcVar5,&local_60);
      __cxa_throw(pcVar5,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = (*move_constructor)(_src);
    break;
  case reference_internal:
    *local_70 = _src;
    piVar3->field_0x30 = piVar3->field_0x30 & 0xfe;
    keep_alive_impl(local_38,parent);
    goto LAB_002f9760;
  default:
    pcVar5 = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(pcVar5,"unhandled return_value_policy: should not happen!");
    __cxa_throw(pcVar5,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *local_70 = pvVar4;
LAB_002f9756:
  bVar1 = piVar3->field_0x30 | 1;
LAB_002f975c:
  piVar3->field_0x30 = bVar1;
LAB_002f9760:
  (*tinfo->init_instance)(piVar3,existing_holder);
  this = &local_38;
  hVar2.m_ptr = local_38.m_ptr;
LAB_002f9771:
  this->m_ptr = (PyObject *)0x0;
  object::~object((object *)this);
  return (handle)hVar2.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        if (handle registered_inst = find_registered_python_instance(src, tinfo))
            return registered_inst;

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = copy, but type is "
                                     "non-copyable! (compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = copy, but type " +
                                     type_name + " is non-copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = move, but type is neither "
                                     "movable nor copyable! "
                                     "(compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = move, but type " +
                                     type_name + " is neither movable nor copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }